

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkylineBinPack.cpp
# Opt level: O0

Rect __thiscall
SkylineBinPack::FindPositionForNewNodeBottomLeft
          (SkylineBinPack *this,int width,int height,int *bestHeight,int *bestWidth,int *bestIndex)

{
  Rect RVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  SkylineNode *pSVar5;
  int local_48;
  uint local_44;
  int y;
  uint i;
  int *bestIndex_local;
  int *bestWidth_local;
  int *bestHeight_local;
  int height_local;
  int width_local;
  SkylineBinPack *this_local;
  Rect newNode;
  
  *bestHeight = 0x7fffffff;
  *bestIndex = -1;
  *bestWidth = 0x7fffffff;
  _y = (uint *)bestIndex;
  bestIndex_local = bestWidth;
  bestWidth_local = bestHeight;
  bestHeight_local._0_4_ = height;
  bestHeight_local._4_4_ = width;
  _height_local = this;
  memset(&this_local,0,0x10);
  local_44 = 0;
  do {
    uVar2 = local_44;
    uVar4 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::Size(&this->skyLine);
    if (uVar4 <= uVar2) {
      RVar1.y = this_local._4_4_;
      RVar1.x = (int)this_local;
      RVar1.width = newNode.x;
      RVar1.height = newNode.y;
      return RVar1;
    }
    bVar3 = RectangleFits(this,local_44,bestHeight_local._4_4_,(int)bestHeight_local,&local_48);
    if ((bVar3) &&
       ((local_48 + (int)bestHeight_local < *bestWidth_local ||
        ((local_48 + (int)bestHeight_local == *bestWidth_local &&
         (pSVar5 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::operator[]
                             (&this->skyLine,(ulong)local_44), pSVar5->width < *bestIndex_local)))))
       ) {
      *bestWidth_local = local_48 + (int)bestHeight_local;
      *_y = local_44;
      pSVar5 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::operator[]
                         (&this->skyLine,(ulong)local_44);
      *bestIndex_local = pSVar5->width;
      pSVar5 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::operator[]
                         (&this->skyLine,(ulong)local_44);
      this_local._0_4_ = pSVar5->x;
      this_local._4_4_ = local_48;
      newNode.x = bestHeight_local._4_4_;
      newNode.y = (int)bestHeight_local;
      bVar3 = DisjointRectCollection::Disjoint(&this->disjointRects,(Rect *)&this_local);
      if (!bVar3) {
        __assert_fail("disjointRects.Disjoint(newNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                      ,0x138,
                      "Rect SkylineBinPack::FindPositionForNewNodeBottomLeft(int, int, int &, int &, int &) const"
                     );
      }
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

Rect SkylineBinPack::FindPositionForNewNodeBottomLeft(int width, int height, int &bestHeight, int &bestWidth, int &bestIndex) const
{
	bestHeight = INT_MAX;
	bestIndex = -1;
	// Used to break ties if there are nodes at the same level. Then pick the narrowest one.
	bestWidth = INT_MAX;
	Rect newNode = { 0, 0, 0, 0 };
	for(unsigned i = 0; i < skyLine.Size(); ++i)
	{
		int y;
		if (RectangleFits(i, width, height, y))
		{
			if (y + height < bestHeight || (y + height == bestHeight && skyLine[i].width < bestWidth))
			{
				bestHeight = y + height;
				bestIndex = i;
				bestWidth = skyLine[i].width;
				newNode.x = skyLine[i].x;
				newNode.y = y;
				newNode.width = width;
				newNode.height = height;
#ifdef _DEBUG
				assert(disjointRects.Disjoint(newNode));
#endif
			}
		}
/*		if (RectangleFits(i, height, width, y))
		{
			if (y + width < bestHeight || (y + width == bestHeight && skyLine[i].width < bestWidth))
			{
				bestHeight = y + width;
				bestIndex = i;
				bestWidth = skyLine[i].width;
				newNode.x = skyLine[i].x;
				newNode.y = y;
				newNode.width = height;
				newNode.height = width;
				assert(disjointRects.Disjoint(newNode));
			}
		}
*/	}

	return newNode;
}